

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::createInstance
          (BeagleCPUImpl<double,_1,_0> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenDecompositionCount,
          int matrixCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags)

{
  double ***pppdVar1;
  size_t __size;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  EigenDecompositionSquare<double,_1> *this_00;
  double **ppdVar14;
  double *pdVar15;
  int **ppiVar16;
  short *psVar17;
  double *pdVar18;
  void *pvVar19;
  int *piVar20;
  undefined8 *puVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  size_t sVar27;
  long lVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 in_ZMM6 [64];
  void *ptr;
  double *local_88;
  size_t local_80;
  undefined1 local_78 [64];
  
  this->realtypeMin = 2.2250738585072014e-308;
  this->scalingExponentThreshold = 200;
  *(int *)&(this->super_BeagleImpl).field_0xc = partialsBufferCount + compactBufferCount;
  this->kTipCount = tipCount;
  this->kStateCount = stateCount;
  this->kPatternCount = patternCount;
  this->kPartitionCount = 1;
  this->kMaxPartitionCount = 1;
  this->kPartitionsInitialised = false;
  this->kPatternsReordered = false;
  this->kInternalPartialsBufferCount = (partialsBufferCount + compactBufferCount) - tipCount;
  this->kTransPaddedStateCount = stateCount + 1;
  this->kPartialsPaddedStateCount = stateCount;
  iVar10 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x5c])();
  iVar2 = this->kStateCount;
  iVar22 = this->kPatternCount % iVar10;
  iVar10 = iVar10 - iVar22;
  if (iVar22 == 0) {
    iVar10 = 0;
  }
  iVar22 = this->kPatternCount + iVar10;
  this->kPaddedPatternCount = iVar22;
  this->kExtraPatterns = iVar10;
  this->kMatrixCount = matrixCount;
  this->kEigenDecompCount = eigenDecompositionCount;
  this->kCategoryCount = categoryCount;
  this->kScaleBufferCount = scaleBufferCount;
  this->kMatrixSize = (iVar2 + 1) * iVar2;
  this->kFlags = 0;
  uVar26 = (uint)requirementFlags;
  uVar11 = (uint)preferenceFlags;
  if ((char)((byte)requirementFlags | (byte)preferenceFlags) < '\0') {
    this->kFlags = 0x480;
    iVar10 = this->kInternalPartialsBufferCount;
LAB_0011fc5c:
    this->kScaleBufferCount = iVar10;
  }
  else {
    if (((uVar26 | uVar11) >> 8 & 1) != 0) {
      this->kFlags = 0x500;
      iVar10 = this->kInternalPartialsBufferCount + 1;
      goto LAB_0011fc5c;
    }
    if (((uVar26 | uVar11) >> 0x19 & 1) == 0) {
      if (((uVar26 | uVar11) >> 10 & 1) == 0) {
        this->kFlags = 0x240;
      }
      else {
        this->kFlags = 0x440;
      }
    }
    else {
      this->kFlags = 0x2000200;
    }
  }
  uVar26 = uVar26 | uVar11;
  uVar13 = (ulong)(((uVar26 & 0x20) >> 5) << 4) + 0x10 | this->kFlags;
  lVar24 = 0x40000000;
  if ((uVar26 >> 0x1e & 1) == 0) {
    lVar24 = 0x4000;
  }
  uVar23 = (ulong)(uVar26 >> 1 & 0x100000) + 0x100000 + lVar24 | uVar13;
  this->kFlags = uVar23;
  if ((uVar13 & 0x20) == 0) {
    this_00 = (EigenDecompositionSquare<double,_1> *)operator_new(0x48);
    EigenDecompositionCube<double,_1>::EigenDecompositionCube
              ((EigenDecompositionCube<double,_1> *)this_00,eigenDecompositionCount,iVar2,
               categoryCount,uVar23);
  }
  else {
    this_00 = (EigenDecompositionSquare<double,_1> *)operator_new(0x58);
    EigenDecompositionSquare<double,_1>::EigenDecompositionSquare
              (this_00,eigenDecompositionCount,iVar2,categoryCount,uVar23);
  }
  this->gEigenDecomposition = &this_00->super_EigenDecomposition<double,_1>;
  sVar27 = (size_t)this->kEigenDecompCount;
  ppdVar14 = (double **)calloc(8,sVar27);
  this->gCategoryRates = ppdVar14;
  if (ppdVar14 != (double **)0x0) {
    pdVar15 = (double *)malloc((long)this->kPatternCount << 3);
    this->gPatternWeights = pdVar15;
    if (pdVar15 != (double *)0x0) {
      this->kPartialsSize =
           this->kPartialsPaddedStateCount * this->kPaddedPatternCount * this->kCategoryCount;
      iVar2 = *(int *)&(this->super_BeagleImpl).field_0xc;
      __size = (long)iVar2 * 8;
      ppdVar14 = (double **)malloc(__size);
      this->gPartials = ppdVar14;
      if (ppdVar14 != (double **)0x0) {
        ppdVar14 = (double **)calloc(8,sVar27);
        this->gStateFrequencies = ppdVar14;
        if (ppdVar14 != (double **)0x0) {
          ppdVar14 = (double **)calloc(8,sVar27);
          this->gCategoryWeights = ppdVar14;
          if (ppdVar14 != (double **)0x0) {
            ppiVar16 = (int **)malloc(__size);
            this->gTipStates = ppiVar16;
            if (ppiVar16 != (int **)0x0) {
              if (0 < iVar2) {
                lVar24 = 0;
                do {
                  this->gPartials[lVar24] = (double *)0x0;
                  this->gTipStates[lVar24] = (int *)0x0;
                  lVar24 = lVar24 + 1;
                } while (iVar2 != lVar24);
              }
              lVar24 = (long)this->kTipCount;
              if (this->kTipCount < *(int *)&(this->super_BeagleImpl).field_0xc) {
                do {
                  local_88 = (double *)0x0;
                  posix_memalign(&local_88,0x20,(long)this->kPartialsSize << 3);
                  this->gPartials[lVar24] = local_88;
                  if (this->gPartials[lVar24] == (double *)0x0) goto LAB_001205c9;
                  lVar24 = lVar24 + 1;
                } while (lVar24 < *(int *)&(this->super_BeagleImpl).field_0xc);
              }
              this->gScaleBuffers = (double **)0x0;
              this->gAutoScaleBuffers = (short **)0x0;
              lVar24 = this->kFlags;
              iVar2 = this->kScaleBufferCount;
              lVar25 = (long)iVar2;
              ppdVar14 = (double **)malloc(lVar25 * 8);
              auVar48 = in_ZMM6._0_16_;
              if ((char)lVar24 < '\0') {
                this->gAutoScaleBuffers = (short **)ppdVar14;
                if (ppdVar14 == (double **)0x0) goto LAB_001205c9;
                if (0 < iVar2) {
                  lVar24 = 0;
                  do {
                    psVar17 = (short *)malloc((long)iVar22 * 2);
                    auVar48 = in_ZMM6._0_16_;
                    this->gAutoScaleBuffers[lVar24] = psVar17;
                    if (this->gAutoScaleBuffers[lVar24] == (short *)0x0) goto LAB_001205c9;
                    lVar24 = lVar24 + 1;
                  } while (lVar25 != lVar24);
                }
                piVar20 = (int *)malloc((long)this->kInternalPartialsBufferCount << 2);
                this->gActiveScalingFactors = piVar20;
                ppdVar14 = (double **)malloc(8);
                this->gScaleBuffers = ppdVar14;
                pdVar15 = (double *)malloc((long)iVar22 << 3);
                *ppdVar14 = pdVar15;
              }
              else {
                pppdVar1 = &this->gScaleBuffers;
                *pppdVar1 = ppdVar14;
                if (ppdVar14 == (double **)0x0) goto LAB_001205c9;
                if (0 < iVar2) {
                  local_80 = (long)iVar22 << 3;
                  auVar29 = vpbroadcastq_avx512f();
                  lVar28 = 0;
                  local_78 = vmovdqu64_avx512f(auVar29);
                  do {
                    in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
                    pdVar15 = (double *)malloc(local_80);
                    auVar48 = in_ZMM6._0_16_;
                    (*pppdVar1)[lVar28] = pdVar15;
                    pdVar15 = (*pppdVar1)[lVar28];
                    if (pdVar15 == (double *)0x0) goto LAB_001205c9;
                    auVar29 = vmovdqu64_avx512f(local_78);
                    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar31 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
                    if (0 < iVar22 && ((uint)lVar24 >> 0x19 & 1) != 0) {
                      uVar13 = 0;
                      do {
                        auVar32 = vpbroadcastq_avx512f();
                        auVar32 = vporq_avx512f(auVar32,auVar30);
                        uVar23 = vpcmpuq_avx512f(auVar32,auVar29,2);
                        pdVar18 = pdVar15 + uVar13;
                        bVar3 = (bool)((byte)uVar23 & 1);
                        bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar23 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar23 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar23 >> 6) & 1);
                        *pdVar18 = (double)((ulong)bVar3 * auVar31._0_8_ |
                                           (ulong)!bVar3 * (long)*pdVar18);
                        pdVar18[1] = (double)((ulong)bVar4 * auVar31._8_8_ |
                                             (ulong)!bVar4 * (long)pdVar18[1]);
                        pdVar18[2] = (double)((ulong)bVar5 * auVar31._16_8_ |
                                             (ulong)!bVar5 * (long)pdVar18[2]);
                        pdVar18[3] = (double)((ulong)bVar6 * auVar31._24_8_ |
                                             (ulong)!bVar6 * (long)pdVar18[3]);
                        pdVar18[4] = (double)((ulong)bVar7 * auVar31._32_8_ |
                                             (ulong)!bVar7 * (long)pdVar18[4]);
                        pdVar18[5] = (double)((ulong)bVar8 * auVar31._40_8_ |
                                             (ulong)!bVar8 * (long)pdVar18[5]);
                        pdVar18[6] = (double)((ulong)bVar9 * auVar31._48_8_ |
                                             (ulong)!bVar9 * (long)pdVar18[6]);
                        pdVar18[7] = (double)((uVar23 >> 7) * auVar31._56_8_ |
                                             (ulong)!SUB81(uVar23 >> 7,0) * (long)pdVar18[7]);
                        uVar13 = uVar13 + 8;
                      } while ((iVar22 + 7U & 0xfffffff8) != uVar13);
                    }
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != lVar25);
                }
              }
              auVar29 = ZEXT1664(auVar48);
              ppdVar14 = (double **)malloc((long)this->kMatrixCount << 3);
              auVar48 = auVar29._0_16_;
              this->gTransitionMatrices = ppdVar14;
              if (ppdVar14 != (double **)0x0) {
                if (0 < this->kMatrixCount) {
                  lVar24 = 0;
                  do {
                    local_88 = (double *)0x0;
                    posix_memalign(&local_88,0x20,
                                   (long)this->kCategoryCount * (long)this->kMatrixSize * 8);
                    auVar48 = auVar29._0_16_;
                    this->gTransitionMatrices[lVar24] = local_88;
                    if (this->gTransitionMatrices[lVar24] == (double *)0x0) goto LAB_001205c9;
                    lVar24 = lVar24 + 1;
                  } while (lVar24 < this->kMatrixCount);
                }
                local_88 = (double *)0x0;
                posix_memalign(&local_88,0x20,
                               (long)this->kStateCount * (long)this->kPatternCount * 8);
                this->integrationTmp = local_88;
                sVar27 = (long)this->kStateCount * (long)this->kPatternCount * 8;
                pdVar15 = (double *)malloc(sVar27);
                this->firstDerivTmp = pdVar15;
                pdVar15 = (double *)malloc(sVar27);
                this->secondDerivTmp = pdVar15;
                local_88 = (double *)0x0;
                posix_memalign(&local_88,0x20,(long)this->kPaddedPatternCount << 3);
                this->grandDenominatorDerivTmp = local_88;
                local_88 = (double *)0x0;
                posix_memalign(&local_88,0x20,(long)this->kPaddedPatternCount << 3);
                this->grandNumeratorDerivTmp = local_88;
                this->crossProductNumeratorTmp = (double *)0x0;
                sVar27 = (long)this->kStateCount * (long)this->kPatternCount * 8;
                pdVar15 = (double *)malloc(sVar27);
                this->outLogLikelihoodsTmp = pdVar15;
                pdVar15 = (double *)malloc(sVar27);
                this->outFirstDerivativesTmp = pdVar15;
                pdVar15 = (double *)malloc(sVar27);
                this->outSecondDerivativesTmp = pdVar15;
                iVar2 = this->kPaddedPatternCount;
                sVar27 = (long)iVar2 * 8;
                pdVar15 = (double *)malloc(sVar27);
                this->zeros = pdVar15;
                pdVar18 = (double *)malloc(sVar27);
                this->ones = pdVar18;
                if (0 < (long)iVar2) {
                  uVar13 = 0;
                  memset(pdVar15,0,sVar27);
                  auVar29 = vpbroadcastq_avx512f();
                  auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar31 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
                  do {
                    auVar32 = vpbroadcastq_avx512f();
                    auVar32 = vporq_avx512f(auVar32,auVar30);
                    uVar23 = vpcmpuq_avx512f(auVar32,auVar29,2);
                    pdVar15 = pdVar18 + uVar13;
                    bVar3 = (bool)((byte)uVar23 & 1);
                    bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
                    bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
                    bVar7 = (bool)((byte)(uVar23 >> 4) & 1);
                    bVar8 = (bool)((byte)(uVar23 >> 5) & 1);
                    bVar9 = (bool)((byte)(uVar23 >> 6) & 1);
                    *pdVar15 = (double)((ulong)bVar3 * auVar31._0_8_ |
                                       (ulong)!bVar3 * (long)*pdVar15);
                    pdVar15[1] = (double)((ulong)bVar4 * auVar31._8_8_ |
                                         (ulong)!bVar4 * (long)pdVar15[1]);
                    pdVar15[2] = (double)((ulong)bVar5 * auVar31._16_8_ |
                                         (ulong)!bVar5 * (long)pdVar15[2]);
                    pdVar15[3] = (double)((ulong)bVar6 * auVar31._24_8_ |
                                         (ulong)!bVar6 * (long)pdVar15[3]);
                    pdVar15[4] = (double)((ulong)bVar7 * auVar31._32_8_ |
                                         (ulong)!bVar7 * (long)pdVar15[4]);
                    pdVar15[5] = (double)((ulong)bVar8 * auVar31._40_8_ |
                                         (ulong)!bVar8 * (long)pdVar15[5]);
                    pdVar15[6] = (double)((ulong)bVar9 * auVar31._48_8_ |
                                         (ulong)!bVar9 * (long)pdVar15[6]);
                    pdVar15[7] = (double)((uVar23 >> 7) * auVar31._56_8_ |
                                         (ulong)!SUB81(uVar23 >> 7,0) * (long)pdVar15[7]);
                    uVar13 = uVar13 + 8;
                  } while ((iVar2 + 7U & 0xfffffff8) != uVar13);
                }
                this->kThreadingEnabled = false;
                this->kAutoPartitioningEnabled = false;
                if ((this->kFlags & 0x40000000) != 0) {
                  auVar29 = ZEXT1664(auVar48);
                  uVar11 = std::thread::hardware_concurrency();
                  if (this->kStateCount < 5) {
                    this->kMinPatternCount = 0x100;
                    if ((int)uVar11 < 0x10) {
                      this->kMinPatternCount = 0x300;
                    }
                    else if (this->kPatternCount < 0x40000) {
                      uVar11 = 0x10;
                    }
                  }
                  else {
                    this->kMinPatternCount = 2;
                  }
                  iVar2 = this->kPatternCount;
                  if (2 < (int)uVar11 && this->kMinPatternCount <= iVar2) {
                    uVar12 = iVar2 / (this->kMinPatternCount / 2);
                    uVar26 = uVar11 >> 1;
                    if ((int)uVar12 < (int)(uVar11 >> 1)) {
                      uVar26 = uVar12;
                    }
                    pvVar19 = malloc((long)iVar2 * 4);
                    iVar10 = iVar2 / (int)uVar26;
                    if (0 < iVar2) {
                      auVar30 = vpbroadcastq_avx512f();
                      auVar31 = vpbroadcastd_avx512f();
                      auVar32 = vpbroadcastd_avx512f();
                      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      uVar13 = 0;
                      auVar35 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      do {
                        uVar23 = vpcmpuq_avx512f(auVar34,auVar30,2);
                        iVar22 = (int)uVar13;
                        if ((uVar23 & 1) != 0) {
                          auVar29 = ZEXT464((uint)((long)((ulong)(uint)(iVar22 >> 0x1f) << 0x20 |
                                                         uVar13 & 0xffffffff) / (long)iVar10));
                        }
                        if ((uVar23 & 2) != 0) {
                          auVar48 = vpinsrd_avx(auVar29._0_16_,(iVar22 + 1) / iVar10,1);
                          auVar29 = vinserti32x4_avx512f(auVar29,auVar48,0);
                        }
                        if ((uVar23 & 4) != 0) {
                          auVar48 = vpinsrd_avx(auVar29._0_16_,(iVar22 + 2) / iVar10,2);
                          auVar29 = vinserti32x4_avx512f(auVar29,auVar48,0);
                        }
                        if ((uVar23 & 8) != 0) {
                          auVar48 = vpinsrd_avx(auVar29._0_16_,(iVar22 + 3) / iVar10,3);
                          auVar29 = vinserti32x4_avx512f(auVar29,auVar48,0);
                        }
                        auVar47 = auVar29;
                        if ((uVar23 & 0x10) != 0) {
                          auVar36 = vpbroadcastd_avx512f();
                          auVar47._0_16_ = auVar29._0_16_;
                          auVar47._16_4_ = auVar36._16_4_;
                          auVar47._20_4_ = auVar29._20_4_;
                          auVar47._24_4_ = auVar29._24_4_;
                          auVar47._28_4_ = auVar29._28_4_;
                          auVar47._32_4_ = auVar29._32_4_;
                          auVar47._36_4_ = auVar29._36_4_;
                          auVar47._40_4_ = auVar29._40_4_;
                          auVar47._44_4_ = auVar29._44_4_;
                          auVar47._48_4_ = auVar29._48_4_;
                          auVar47._52_4_ = auVar29._52_4_;
                          auVar47._56_4_ = auVar29._56_4_;
                          auVar47._60_4_ = auVar29._60_4_;
                        }
                        auVar36 = auVar47;
                        if ((uVar23 & 0x20) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar36._0_20_ = auVar47._0_20_;
                          auVar36._20_4_ = auVar29._20_4_;
                          auVar36._24_4_ = auVar47._24_4_;
                          auVar36._28_4_ = auVar47._28_4_;
                          auVar36._32_4_ = auVar47._32_4_;
                          auVar36._36_4_ = auVar47._36_4_;
                          auVar36._40_4_ = auVar47._40_4_;
                          auVar36._44_4_ = auVar47._44_4_;
                          auVar36._48_4_ = auVar47._48_4_;
                          auVar36._52_4_ = auVar47._52_4_;
                          auVar36._56_4_ = auVar47._56_4_;
                          auVar36._60_4_ = auVar47._60_4_;
                        }
                        auVar37 = auVar36;
                        if ((uVar23 & 0x40) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar37._0_24_ = auVar36._0_24_;
                          auVar37._24_4_ = auVar29._24_4_;
                          auVar37._28_4_ = auVar36._28_4_;
                          auVar37._32_4_ = auVar36._32_4_;
                          auVar37._36_4_ = auVar36._36_4_;
                          auVar37._40_4_ = auVar36._40_4_;
                          auVar37._44_4_ = auVar36._44_4_;
                          auVar37._48_4_ = auVar36._48_4_;
                          auVar37._52_4_ = auVar36._52_4_;
                          auVar37._56_4_ = auVar36._56_4_;
                          auVar37._60_4_ = auVar36._60_4_;
                        }
                        auVar38 = auVar37;
                        if ((uVar23 & 0x80) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar38._0_28_ = auVar37._0_28_;
                          auVar38._28_4_ = auVar29._28_4_;
                          auVar38._32_4_ = auVar37._32_4_;
                          auVar38._36_4_ = auVar37._36_4_;
                          auVar38._40_4_ = auVar37._40_4_;
                          auVar38._44_4_ = auVar37._44_4_;
                          auVar38._48_4_ = auVar37._48_4_;
                          auVar38._52_4_ = auVar37._52_4_;
                          auVar38._56_4_ = auVar37._56_4_;
                          auVar38._60_4_ = auVar37._60_4_;
                        }
                        uVar23 = vpcmpuq_avx512f(auVar33,auVar30,2);
                        auVar39 = auVar38;
                        if ((uVar23 & 1) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar39._0_32_ = auVar38._0_32_;
                          auVar39._32_4_ = auVar29._32_4_;
                          auVar39._36_4_ = auVar38._36_4_;
                          auVar39._40_4_ = auVar38._40_4_;
                          auVar39._44_4_ = auVar38._44_4_;
                          auVar39._48_4_ = auVar38._48_4_;
                          auVar39._52_4_ = auVar38._52_4_;
                          auVar39._56_4_ = auVar38._56_4_;
                          auVar39._60_4_ = auVar38._60_4_;
                        }
                        auVar40 = auVar39;
                        if ((uVar23 & 2) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar40._0_36_ = auVar39._0_36_;
                          auVar40._36_4_ = auVar29._36_4_;
                          auVar40._40_4_ = auVar39._40_4_;
                          auVar40._44_4_ = auVar39._44_4_;
                          auVar40._48_4_ = auVar39._48_4_;
                          auVar40._52_4_ = auVar39._52_4_;
                          auVar40._56_4_ = auVar39._56_4_;
                          auVar40._60_4_ = auVar39._60_4_;
                        }
                        auVar41 = auVar40;
                        if ((uVar23 & 4) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar41._0_40_ = auVar40._0_40_;
                          auVar41._40_4_ = auVar29._40_4_;
                          auVar41._44_4_ = auVar40._44_4_;
                          auVar41._48_4_ = auVar40._48_4_;
                          auVar41._52_4_ = auVar40._52_4_;
                          auVar41._56_4_ = auVar40._56_4_;
                          auVar41._60_4_ = auVar40._60_4_;
                        }
                        auVar42 = auVar41;
                        if ((uVar23 & 8) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar42._0_44_ = auVar41._0_44_;
                          auVar42._44_4_ = auVar29._44_4_;
                          auVar42._48_4_ = auVar41._48_4_;
                          auVar42._52_4_ = auVar41._52_4_;
                          auVar42._56_4_ = auVar41._56_4_;
                          auVar42._60_4_ = auVar41._60_4_;
                        }
                        auVar43 = auVar42;
                        if ((uVar23 & 0x10) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar43._0_48_ = auVar42._0_48_;
                          auVar43._48_4_ = auVar29._48_4_;
                          auVar43._52_4_ = auVar42._52_4_;
                          auVar43._56_4_ = auVar42._56_4_;
                          auVar43._60_4_ = auVar42._60_4_;
                        }
                        auVar44 = auVar43;
                        if ((uVar23 & 0x20) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar44._0_52_ = auVar43._0_52_;
                          auVar44._52_4_ = auVar29._52_4_;
                          auVar44._56_4_ = auVar43._56_4_;
                          auVar44._60_4_ = auVar43._60_4_;
                        }
                        auVar45 = auVar44;
                        if ((uVar23 & 0x40) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar45._0_56_ = auVar44._0_56_;
                          auVar45._56_4_ = auVar29._56_4_;
                          auVar45._60_4_ = auVar44._60_4_;
                        }
                        auVar46 = auVar45;
                        if ((uVar23 & 0x80) != 0) {
                          auVar29 = vpbroadcastd_avx512f();
                          auVar46._60_4_ = auVar29._60_4_;
                          auVar46._0_60_ = auVar45._0_60_;
                        }
                        uVar23 = vpcmpgtd_avx512f(auVar31,auVar46);
                        auVar47 = vpblendmd_avx512f(auVar32,auVar46);
                        bVar3 = (bool)((byte)uVar23 & 1);
                        auVar29._0_4_ = (uint)bVar3 * auVar47._0_4_ | (uint)!bVar3 * auVar46._0_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
                        auVar29._4_4_ = (uint)bVar3 * auVar47._4_4_ | (uint)!bVar3 * auVar46._4_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
                        auVar29._8_4_ = (uint)bVar3 * auVar47._8_4_ | (uint)!bVar3 * auVar46._8_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 3) & 1);
                        auVar29._12_4_ =
                             (uint)bVar3 * auVar47._12_4_ | (uint)!bVar3 * auVar46._12_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 4) & 1);
                        auVar29._16_4_ =
                             (uint)bVar3 * auVar47._16_4_ | (uint)!bVar3 * auVar46._16_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 5) & 1);
                        auVar29._20_4_ =
                             (uint)bVar3 * auVar47._20_4_ | (uint)!bVar3 * auVar46._20_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 6) & 1);
                        auVar29._24_4_ =
                             (uint)bVar3 * auVar47._24_4_ | (uint)!bVar3 * auVar46._24_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 7) & 1);
                        auVar29._28_4_ =
                             (uint)bVar3 * auVar47._28_4_ | (uint)!bVar3 * auVar46._28_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 8) & 1);
                        auVar29._32_4_ =
                             (uint)bVar3 * auVar47._32_4_ | (uint)!bVar3 * auVar46._32_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 9) & 1);
                        auVar29._36_4_ =
                             (uint)bVar3 * auVar47._36_4_ | (uint)!bVar3 * auVar46._36_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 10) & 1);
                        auVar29._40_4_ =
                             (uint)bVar3 * auVar47._40_4_ | (uint)!bVar3 * auVar46._40_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 0xb) & 1);
                        auVar29._44_4_ =
                             (uint)bVar3 * auVar47._44_4_ | (uint)!bVar3 * auVar46._44_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 0xc) & 1);
                        auVar29._48_4_ =
                             (uint)bVar3 * auVar47._48_4_ | (uint)!bVar3 * auVar46._48_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 0xd) & 1);
                        auVar29._52_4_ =
                             (uint)bVar3 * auVar47._52_4_ | (uint)!bVar3 * auVar46._52_4_;
                        bVar3 = (bool)((byte)(uVar23 >> 0xe) & 1);
                        auVar29._56_4_ =
                             (uint)bVar3 * auVar47._56_4_ | (uint)!bVar3 * auVar46._56_4_;
                        bVar3 = SUB81(uVar23 >> 0xf,0);
                        auVar29._60_4_ =
                             (uint)bVar3 * auVar47._60_4_ | (uint)!bVar3 * auVar46._60_4_;
                        auVar47 = vmovdqu32_avx512f(auVar29);
                        *(undefined1 (*) [64])((long)pvVar19 + uVar13 * 4) = auVar47;
                        uVar13 = uVar13 + 0x10;
                        auVar34 = vpaddq_avx512f(auVar34,auVar35);
                        auVar33 = vpaddq_avx512f(auVar33,auVar35);
                      } while ((iVar2 + 0xfU & 0xfffffff0) != uVar13);
                    }
                    (*(this->super_BeagleImpl)._vptr_BeagleImpl[0xe])(this,(ulong)uVar26,pvVar19);
                    piVar20 = (int *)malloc((long)this->kPartitionCount *
                                            (long)*(int *)&(this->super_BeagleImpl).field_0xc * 0x24
                                           );
                    this->gAutoPartitionOperations = piVar20;
                    if (this->kMinPatternCount * 4 <= this->kPatternCount) {
                      piVar20 = (int *)malloc((long)(int)uVar26 * 4);
                      this->gAutoPartitionIndices = piVar20;
                      if (0 < (int)uVar26) {
                        auVar29 = vpbroadcastq_avx512f();
                        auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        auVar32 = vpmovsxbd_avx512f(_DAT_00141b90);
                        lVar24 = 0;
                        auVar33 = vpbroadcastq_avx512f(ZEXT816(0x10));
                        auVar34 = vpbroadcastd_avx512f(ZEXT416(0x10));
                        do {
                          vpcmpuq_avx512f(auVar31,auVar29,2);
                          vpcmpuq_avx512f(auVar30,auVar29,2);
                          auVar35 = vmovdqu32_avx512f(auVar32);
                          *(undefined1 (*) [64])((long)piVar20 + lVar24) = auVar35;
                          auVar31 = vpaddq_avx512f(auVar31,auVar33);
                          auVar30 = vpaddq_avx512f(auVar30,auVar33);
                          auVar32 = vpaddd_avx512f(auVar32,auVar34);
                          lVar24 = lVar24 + 0x40;
                        } while ((ulong)(uVar26 + 0xf >> 4) << 6 != lVar24);
                      }
                      pdVar15 = (double *)malloc((long)(int)uVar26 << 3);
                      this->gAutoPartitionOutSumLogLikelihoods = pdVar15;
                      this->kAutoRootPartitioningEnabled = false;
                    }
                    this->kAutoPartitioningEnabled = false;
                  }
                }
                return 0;
              }
            }
          }
        }
      }
    }
  }
LAB_001205c9:
  puVar21 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar21 = __cxa_init_primary_exception;
  __cxa_throw(puVar21,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::createInstance(int tipCount,
                                  int partialsBufferCount,
                                  int compactBufferCount,
                                  int stateCount,
                                  int patternCount,
                                  int eigenDecompositionCount,
                                  int matrixCount,
                                  int categoryCount,
                                  int scaleBufferCount,
                                  int resourceNumber,
                                  int pluginResourceNumber,
                                  long preferenceFlags,
                                  long requirementFlags) {
    if (DEBUGGING_OUTPUT)
        std::cerr << "in BeagleCPUImpl::initialize\n" ;

    if (DOUBLE_PRECISION) {
        realtypeMin = DBL_MIN;
        scalingExponentThreshold = 200;
    } else {
        realtypeMin = FLT_MIN;
        scalingExponentThreshold = 20;
    }

    kBufferCount = partialsBufferCount + compactBufferCount;
    kTipCount = tipCount;
    assert(kBufferCount > kTipCount);
    kStateCount = stateCount;
    kPatternCount = patternCount;

    kPartitionCount = 1;
    kMaxPartitionCount = kPartitionCount;
    kPartitionsInitialised = false;
    kPatternsReordered = false;

    kInternalPartialsBufferCount = kBufferCount - kTipCount;

    kTransPaddedStateCount = kStateCount + T_PAD;
    kPartialsPaddedStateCount = kStateCount + P_PAD;

    // Handle possible padding of pattern sites for vectorization
    int modulus = getPaddedPatternsModulus();
    kPaddedPatternCount = kPatternCount;
    int remainder = kPatternCount % modulus;
    if (remainder != 0) {
        kPaddedPatternCount += modulus - remainder;
    }
    kExtraPatterns = kPaddedPatternCount - kPatternCount;

    kMatrixCount = matrixCount;
    kEigenDecompCount = eigenDecompositionCount;
    kCategoryCount = categoryCount;
    kScaleBufferCount = scaleBufferCount;

    kMatrixSize = (T_PAD + kStateCount) * kStateCount;

    int scaleBufferSize = kPaddedPatternCount;

    kFlags = 0;

    if (preferenceFlags & BEAGLE_FLAG_SCALING_AUTO || requirementFlags & BEAGLE_FLAG_SCALING_AUTO) {
        kFlags |= BEAGLE_FLAG_SCALING_AUTO;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_ALWAYS || requirementFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
        kFlags |= BEAGLE_FLAG_SCALING_ALWAYS;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount + 1; // +1 for temp buffer used by edgelikelihood
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_DYNAMIC || requirementFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
        kFlags |= BEAGLE_FLAG_SCALING_DYNAMIC;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALERS_LOG || requirementFlags & BEAGLE_FLAG_SCALERS_LOG) {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
    } else {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    }

    if (requirementFlags & BEAGLE_FLAG_EIGEN_COMPLEX || preferenceFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        kFlags |= BEAGLE_FLAG_EIGEN_COMPLEX;
    else
        kFlags |= BEAGLE_FLAG_EIGEN_REAL;

    if (requirementFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED || preferenceFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED)
        kFlags |= BEAGLE_FLAG_INVEVEC_TRANSPOSED;
    else
        kFlags |= BEAGLE_FLAG_INVEVEC_STANDARD;

    if (requirementFlags & BEAGLE_FLAG_THREADING_CPP || preferenceFlags & BEAGLE_FLAG_THREADING_CPP)
        kFlags |= BEAGLE_FLAG_THREADING_CPP;
    else
        kFlags |= BEAGLE_FLAG_THREADING_NONE;

    if (kFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        gEigenDecomposition = new EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount,kCategoryCount,kFlags);
    else
        gEigenDecomposition = new EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount, kCategoryCount,kFlags);

    gCategoryRates = (double**) calloc(sizeof(double), kEigenDecompCount);
    if (gCategoryRates == NULL)
        throw std::bad_alloc();

    gPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);
    if (gPatternWeights == NULL)
        throw std::bad_alloc();

    // TODO: if pattern padding is implemented this will create problems with setTipPartials
    kPartialsSize = kPaddedPatternCount * kPartialsPaddedStateCount * kCategoryCount;

    gPartials = (REALTYPE**) malloc(sizeof(REALTYPE*) * kBufferCount);
    if (gPartials == NULL)
     throw std::bad_alloc();

    gStateFrequencies = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gStateFrequencies == NULL)
        throw std::bad_alloc();

    gCategoryWeights = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gCategoryWeights == NULL)
        throw std::bad_alloc();

    // assigning kBufferCount to this array so that we can just check if a tipStateBuffer is
    // allocated
    gTipStates = (int**) malloc(sizeof(int*) * kBufferCount);
    if (gTipStates == NULL)
        throw std::bad_alloc();

    for (int i = 0; i < kBufferCount; i++) {
        gPartials[i] = NULL;
        gTipStates[i] = NULL;
    }

    for (int i = kTipCount; i < kBufferCount; i++) {
        gPartials[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[i] == NULL)
            throw std::bad_alloc();
    }

    gScaleBuffers = NULL;

    gAutoScaleBuffers = NULL;

    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        gAutoScaleBuffers = (signed short**) malloc(sizeof(signed short*) * kScaleBufferCount);
        if (gAutoScaleBuffers == NULL)
            throw std::bad_alloc();
        for (int i = 0; i < kScaleBufferCount; i++) {
            gAutoScaleBuffers[i] = (signed short*) malloc(sizeof(signed short) * scaleBufferSize);
            if (gAutoScaleBuffers[i] == 0L)
                throw std::bad_alloc();
        }
        gActiveScalingFactors = (int*) malloc(sizeof(int) * kInternalPartialsBufferCount);
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*));
        gScaleBuffers[0] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);
    } else {
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*) * kScaleBufferCount);
        if (gScaleBuffers == NULL)
            throw std::bad_alloc();

        for (int i = 0; i < kScaleBufferCount; i++) {
            gScaleBuffers[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);

            if (gScaleBuffers[i] == 0L)
                throw std::bad_alloc();


            if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
                for (int j=0; j < scaleBufferSize; j++) {
                    gScaleBuffers[i][j] = 1.0;
                }
            }
        }
    }


    gTransitionMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kMatrixCount);
    if (gTransitionMatrices == NULL)
        throw std::bad_alloc();
    for (int i = 0; i < kMatrixCount; i++) {
        gTransitionMatrices[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kMatrixSize * kCategoryCount);
        if (gTransitionMatrices[i] == 0L)
            throw std::bad_alloc();
    }

    integrationTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kStateCount);
    firstDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    secondDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

//    cLikelihoodTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kCategoryCount);
    grandDenominatorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount); // TODO Deprecate in favor of integrationTmp
    grandNumeratorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount);
    crossProductNumeratorTmp = nullptr;
//    grandNumeratorLowerBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);
//    grandNumeratorUpperBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);

    outLogLikelihoodsTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outFirstDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outSecondDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

    zeros = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    ones = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    for(int i = 0; i < kPaddedPatternCount; i++) {
        zeros[i] = 0.0;
        ones[i] = 1.0;
    }

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            } else if (kPatternCount < BEAGLE_CPU_ASYNC_LIMIT_PATTERN_COUNT) {
                hardwareThreads = BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > hardwareThreads/2) {
                partitionCount = hardwareThreads/2;
            }
            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = false; //TODO: XJ: need to change this back to true
            }
            // TODO: XJ: need to change below back to true
            kAutoPartitioningEnabled = false;
        }
    }

    return BEAGLE_SUCCESS;
}